

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O1

Split * __thiscall
embree::sse2::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::VirtualRecalculatePrimRef,_2UL>::
TemporalBinInfo::best
          (Split *__return_storage_ptr__,TemporalBinInfo *this,int logBlockSize,BBox1f time_range,
          SetMB *set)

{
  ulong uVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar10 = time_range.lower;
  fVar7 = time_range.upper;
  fVar6 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar8 = (set->super_PrimInfoMB).max_time_range.upper - fVar6;
  fVar9 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  fVar5 = roundf((((fVar10 * 0.5 + fVar7 * 0.5) - fVar6) / fVar8) * fVar9);
  bVar2 = (byte)logBlockSize;
  lVar3 = 1L << (bVar2 & 0x3f);
  fVar6 = (fVar5 / fVar9) * fVar8 + fVar6;
  uVar1 = (this->count1[0] + lVar3) - 1 >> (bVar2 & 0x3f);
  fVar9 = INFINITY;
  fVar5 = 0.0;
  if ((fVar10 < fVar6) && (fVar6 < fVar7)) {
    uVar4 = (lVar3 + this->count0[0]) - 1 >> (bVar2 & 0x3f);
    if (uVar4 != 0) {
      fVar5 = this->bounds0[0].bounds0.upper.field_0.m128[1] -
              this->bounds0[0].bounds0.lower.field_0.m128[1];
      fVar9 = this->bounds0[0].bounds0.upper.field_0.m128[2] -
              this->bounds0[0].bounds0.lower.field_0.m128[2];
      fVar8 = this->bounds0[0].bounds1.upper.field_0.m128[1] -
              this->bounds0[0].bounds1.lower.field_0.m128[1];
      fVar11 = this->bounds0[0].bounds1.upper.field_0.m128[2] -
               this->bounds0[0].bounds1.lower.field_0.m128[2];
      fVar5 = (fVar11 * fVar8 +
               (this->bounds0[0].bounds1.upper.field_0.m128[0] -
               this->bounds0[0].bounds1.lower.field_0.m128[0]) * (fVar8 + fVar11) +
              fVar9 * fVar5 +
              (this->bounds0[0].bounds0.upper.field_0.m128[0] -
              this->bounds0[0].bounds0.lower.field_0.m128[0]) * (fVar5 + fVar9)) * 0.5 *
              (float)uVar4 * (fVar6 - fVar10);
    }
    if (uVar1 == 0) {
      fVar10 = 0.0;
    }
    else {
      fVar10 = this->bounds1[0].bounds0.upper.field_0.m128[1] -
               this->bounds1[0].bounds0.lower.field_0.m128[1];
      fVar9 = this->bounds1[0].bounds0.upper.field_0.m128[2] -
              this->bounds1[0].bounds0.lower.field_0.m128[2];
      fVar8 = this->bounds1[0].bounds1.upper.field_0.m128[1] -
              this->bounds1[0].bounds1.lower.field_0.m128[1];
      fVar11 = this->bounds1[0].bounds1.upper.field_0.m128[2] -
               this->bounds1[0].bounds1.lower.field_0.m128[2];
      fVar10 = (fVar7 - fVar6) *
               ((fVar8 + fVar11) *
                (this->bounds1[0].bounds1.upper.field_0.m128[0] -
                this->bounds1[0].bounds1.lower.field_0.m128[0]) + fVar11 * fVar8 +
               (fVar10 + fVar9) *
               (this->bounds1[0].bounds0.upper.field_0.m128[0] -
               this->bounds1[0].bounds0.lower.field_0.m128[0]) + fVar9 * fVar10) * 0.5 *
               (float)uVar1;
    }
    fVar9 = INFINITY;
    if (fVar5 + fVar10 == INFINITY) {
      fVar5 = 0.0;
    }
    else {
      fVar9 = (fVar5 + fVar10) * 1.25;
      fVar5 = fVar6;
    }
  }
  __return_storage_ptr__->sah = fVar9;
  __return_storage_ptr__->dim = 0;
  (__return_storage_ptr__->field_2).fpos = fVar5;
  __return_storage_ptr__->data = 2;
  return __return_storage_ptr__;
}

Assistant:

Split best(int logBlockSize, BBox1f time_range, const SetMB& set)
          {
            float bestSAH = inf;
            float bestPos = 0.0f;
            for (int b=0; b<BINS-1; b++)
            {
              float t = float(b+1)/float(BINS);
              float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* calculate sah */
              const size_t lCount = (count0[b]+(size_t(1) << logBlockSize)-1) >> int(logBlockSize);
              const size_t rCount = (count1[b]+(size_t(1) << logBlockSize)-1) >> int(logBlockSize);
              float sah0 = expectedApproxHalfArea(bounds0[b])*float(lCount)*dt0.size();
              float sah1 = expectedApproxHalfArea(bounds1[b])*float(rCount)*dt1.size();
              if (unlikely(lCount == 0)) sah0 = 0.0f; // happens for initial splits when objects not alive over entire shutter time
              if (unlikely(rCount == 0)) sah1 = 0.0f;
              const float sah = sah0+sah1;
              if (sah < bestSAH) {
                bestSAH = sah;
                bestPos = center_time;
              }
            }
            return Split(bestSAH*MBLUR_TIME_SPLIT_THRESHOLD,(unsigned)Split::SPLIT_TEMPORAL,0,bestPos);
          }